

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_string.h
# Opt level: O2

size_t frozen::hash_string<std::basic_string_view<char,std::char_traits<char>>>
                 (basic_string_view<char,_std::char_traits<char>_> *value,size_t seed)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = seed ^ 0x811c9dc5;
  for (sVar2 = 0; value->_M_len != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 * 0x1000193 ^ (long)value->_M_str[sVar2];
  }
  return uVar1 * 0x1000193 >> 8;
}

Assistant:

constexpr std::size_t hash_string(const String& value, std::size_t seed) {
  std::size_t d =  (0x811c9dc5 ^ seed) * static_cast<size_t>(0x01000193);
  for (const auto& c : value)
    d = (d ^ static_cast<size_t>(c)) * static_cast<size_t>(0x01000193);
  return d >> 8 ;
}